

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.h
# Opt level: O1

bool CoreML::Specification::operator==(OneHotEncoder *a,OneHotEncoder *b)

{
  uint32 uVar1;
  Int64Vector *a_00;
  StringVector *a_01;
  bool bVar2;
  Int64Vector *b_00;
  StringVector *b_01;
  
  uVar1 = a->_oneof_case_[0];
  if (uVar1 != b->_oneof_case_[0]) {
    return false;
  }
  if (uVar1 == 1) {
    a_01 = (a->CategoryType_).stringcategories_;
    if (b->_oneof_case_[0] == 1) {
      b_01 = (b->CategoryType_).stringcategories_;
    }
    else {
      b_01 = StringVector::default_instance();
    }
    bVar2 = vectorsEqual<CoreML::Specification::StringVector>(a_01,b_01);
  }
  else {
    if (uVar1 != 2) goto LAB_002b9525;
    a_00 = (a->CategoryType_).int64categories_;
    if (b->_oneof_case_[0] == 2) {
      b_00 = (b->CategoryType_).int64categories_;
    }
    else {
      b_00 = Int64Vector::default_instance();
    }
    bVar2 = vectorsEqual<CoreML::Specification::Int64Vector>(a_00,b_00);
  }
  if (bVar2 == false) {
    return false;
  }
LAB_002b9525:
  if (a->outputsparse_ != b->outputsparse_) {
    return false;
  }
  return a->handleunknown_ == b->handleunknown_;
}

Assistant:

inline OneHotEncoder::CategoryTypeCase OneHotEncoder::CategoryType_case() const {
  return OneHotEncoder::CategoryTypeCase(_oneof_case_[0]);
}